

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O2

void __thiscall
double_conversion::DoubleToStringConverter::CreateExponentialRepresentation
          (DoubleToStringConverter *this,char *decimal_digits,int length,int exponent,
          StringBuilder *result_builder)

{
  char cVar1;
  ulong in_RAX;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uStack_28;
  char buffer [6];
  
  cVar1 = *decimal_digits;
  iVar4 = result_builder->position_;
  result_builder->position_ = iVar4 + 1;
  (result_builder->buffer_).start_[iVar4] = cVar1;
  iVar4 = result_builder->position_;
  uStack_28 = in_RAX;
  if (length != 1) {
    result_builder->position_ = iVar4 + 1;
    (result_builder->buffer_).start_[iVar4] = '.';
    memmove((result_builder->buffer_).start_ + result_builder->position_,decimal_digits + 1,
            (long)(length + -1));
    iVar4 = length + -1 + result_builder->position_;
  }
  cVar1 = this->exponent_character_;
  result_builder->position_ = iVar4 + 1;
  (result_builder->buffer_).start_[iVar4] = cVar1;
  if (exponent < 0) {
    iVar4 = result_builder->position_;
    result_builder->position_ = iVar4 + 1;
    (result_builder->buffer_).start_[iVar4] = '-';
    exponent = -exponent;
  }
  else {
    if ((this->flags_ & 1) != 0) {
      iVar4 = result_builder->position_;
      result_builder->position_ = iVar4 + 1;
      (result_builder->buffer_).start_[iVar4] = '+';
    }
    if (exponent == 0) {
      iVar4 = result_builder->position_;
      result_builder->position_ = iVar4 + 1;
      (result_builder->buffer_).start_[iVar4] = '0';
      return;
    }
  }
  uStack_28 = uStack_28 & 0xffffffffffffff;
  lVar5 = 0;
  lVar2 = 0;
  for (; 0 < exponent; exponent = (uint)exponent / 10) {
    buffer[lVar5 + 4] = (byte)((ulong)(uint)exponent % 10) | 0x30;
    lVar2 = lVar2 + 0x100000000;
    lVar5 = lVar5 + -1;
  }
  iVar4 = 5;
  if (this->min_exponent_width_ < 5) {
    iVar4 = this->min_exponent_width_;
  }
  for (lVar3 = -lVar5; lVar3 < iVar4; lVar3 = lVar3 + 1) {
    buffer[lVar5 + 4] = '0';
    lVar2 = lVar2 + 0x100000000;
    lVar5 = lVar5 + -1;
  }
  memcpy((result_builder->buffer_).start_ + result_builder->position_,
         buffer + (0x500000000 - lVar2 >> 0x20),lVar2 >> 0x20);
  result_builder->position_ = result_builder->position_ - (int)lVar5;
  return;
}

Assistant:

void DoubleToStringConverter::CreateExponentialRepresentation(
    const char* decimal_digits,
    int length,
    int exponent,
    StringBuilder* result_builder) const {
  DOUBLE_CONVERSION_ASSERT(length != 0);
  result_builder->AddCharacter(decimal_digits[0]);
  if (length != 1) {
    result_builder->AddCharacter('.');
    result_builder->AddSubstring(&decimal_digits[1], length-1);
  }
  result_builder->AddCharacter(exponent_character_);
  if (exponent < 0) {
    result_builder->AddCharacter('-');
    exponent = -exponent;
  } else {
    if ((flags_ & EMIT_POSITIVE_EXPONENT_SIGN) != 0) {
      result_builder->AddCharacter('+');
    }
  }
  if (exponent == 0) {
    result_builder->AddCharacter('0');
    return;
  }
  DOUBLE_CONVERSION_ASSERT(exponent < 1e4);
  // Changing this constant requires updating the comment of DoubleToStringConverter constructor
  const int kMaxExponentLength = 5;
  char buffer[kMaxExponentLength + 1];
  buffer[kMaxExponentLength] = '\0';
  int first_char_pos = kMaxExponentLength;
  while (exponent > 0) {
    buffer[--first_char_pos] = '0' + (exponent % 10);
    exponent /= 10;
  }
  // Add prefix '0' to make exponent width >= min(min_exponent_with_, kMaxExponentLength)
  // For example: convert 1e+9 -> 1e+09, if min_exponent_with_ is set to 2
  while(kMaxExponentLength - first_char_pos < std::min(min_exponent_width_, kMaxExponentLength)) {
    buffer[--first_char_pos] = '0';
  }
  result_builder->AddSubstring(&buffer[first_char_pos],
                               kMaxExponentLength - first_char_pos);
}